

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O1

void __thiscall VmaBlockVector::AddStatistics(VmaBlockVector *this,VmaStatistics *inoutStats)

{
  bool bVar1;
  ulong uVar2;
  VmaBlockMetadata *pVVar3;
  bool bVar4;
  ulong uVar5;
  pthread_rwlock_t *__rwlock;
  ulong uVar6;
  
  bVar1 = this->m_hAllocator->m_UseMutex;
  __rwlock = (pthread_rwlock_t *)0x0;
  if (bVar1 != false) {
    __rwlock = (pthread_rwlock_t *)&this->m_Mutex;
  }
  if (bVar1 == true) {
    std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)&__rwlock->__data);
  }
  uVar2 = (this->m_Blocks).m_Count;
  if (uVar2 != 0) {
    uVar5 = 0;
    uVar6 = 1;
    do {
      pVVar3 = (this->m_Blocks).m_pArray[uVar5]->m_pMetadata;
      (*pVVar3->_vptr_VmaBlockMetadata[0xf])(pVVar3,inoutStats);
      bVar4 = uVar6 < uVar2;
      uVar5 = uVar6;
      uVar6 = (ulong)((int)uVar6 + 1);
    } while (bVar4);
  }
  if (bVar1 != false) {
    pthread_rwlock_unlock(__rwlock);
    return;
  }
  return;
}

Assistant:

void VmaBlockVector::AddStatistics(VmaStatistics& inoutStats)
{
    VmaMutexLockRead lock(m_Mutex, m_hAllocator->m_UseMutex);

    const size_t blockCount = m_Blocks.size();
    for (uint32_t blockIndex = 0; blockIndex < blockCount; ++blockIndex)
    {
        const VmaDeviceMemoryBlock* const pBlock = m_Blocks[blockIndex];
        VMA_ASSERT(pBlock);
        VMA_HEAVY_ASSERT(pBlock->Validate());
        pBlock->m_pMetadata->AddStatistics(inoutStats);
    }
}